

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssUnsupportedMaskGen_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssUnsupportedMaskGen_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  Input algorithm_identifier;
  AssertionResult gtest_ar_;
  uint8_t kData [45];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  uchar local_48 [56];
  
  local_48[0x20] = '\x06';
  local_48[0x21] = '\t';
  local_48[0x22] = '`';
  local_48[0x23] = 0x86;
  local_48[0x24] = 'H';
  local_48[0x25] = '\x01';
  local_48[0x26] = 'e';
  local_48[0x27] = '\x03';
  local_48[0x28] = '\x04';
  local_48[0x29] = '\x02';
  local_48[0x2a] = '\x03';
  local_48[0x2b] = '\x05';
  local_48[0x2c] = '\0';
  local_48[0x10] = '\x1c';
  local_48[0x11] = '0';
  local_48[0x12] = '\x1a';
  local_48[0x13] = '\x06';
  local_48[0x14] = '\t';
  local_48[0x15] = '*';
  local_48[0x16] = 0x86;
  local_48[0x17] = 'H';
  local_48[0x18] = 0x86;
  local_48[0x19] = 0xf7;
  local_48[0x1a] = 'R';
  local_48[0x1b] = '\x01';
  local_48[0x1c] = '\x02';
  local_48[0x1d] = '\b';
  local_48[0x1e] = '0';
  local_48[0x1f] = '\r';
  local_48[0] = '0';
  local_48[1] = '+';
  local_48[2] = '\x06';
  local_48[3] = '\t';
  local_48[4] = '*';
  local_48[5] = 0x86;
  local_48[6] = 'H';
  local_48[7] = 0x86;
  local_48[8] = 0xf7;
  local_48[9] = '\r';
  local_48[10] = '\x01';
  local_48[0xb] = '\x01';
  local_48[0xc] = '\n';
  local_48[0xd] = '0';
  local_48[0xe] = '\x1e';
  local_48[0xf] = 0xa1;
  algorithm_identifier.data_.size_ = 0x2d;
  algorithm_identifier.data_.data_ = local_48;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  local_78[0] = (internal)
                (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload
                         .super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,(AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x2ff,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssUnsupportedMaskGen) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x2B,  // SEQUENCE (43 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x1E,  // SEQUENCE (30 bytes)
      0xA1, 0x1C,  // [1] (28 bytes)
      0x30, 0x1A,  // SEQUENCE (26 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x52, 0x01, 0x02, 0x08,
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x03,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}